

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O2

int __thiscall
helics::ipc::OwnedQueue::connect(OwnedQueue *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  string *this_00;
  unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
  *this_01;
  void *pvVar1;
  _Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
  __p;
  __off_t __length;
  undefined4 in_register_00000034;
  int maxSize_local;
  int maxMessages_local;
  mapped_region region;
  _Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
  local_80 [4];
  pointer local_60 [4];
  string local_40;
  
  maxMessages_local = (int)__addr;
  if ((this->rqueue)._M_t.
      super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
      .
      super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
      ._M_head_impl !=
      (message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_> *)0x0) {
    boost::interprocess::shared_memory_object::remove((this->connectionName)._M_dataplus._M_p);
  }
  if ((this->queue_state)._M_t.
      super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
      ._M_t.
      super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
      .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl !=
      (shared_memory_object *)0x0) {
    boost::interprocess::shared_memory_object::remove((this->stateName)._M_dataplus._M_p);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->connectionNameOrig,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_00000034,__fd));
  std::__cxx11::string::string
            ((string *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_00000034,__fd));
  stringTranslateToCppName((string *)&region,&local_40);
  this_00 = &this->connectionName;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&region);
  std::__cxx11::string::~string((string *)&region);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&region,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 "_state");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->stateName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&region);
  std::__cxx11::string::~string((string *)&region);
  boost::interprocess::shared_memory_object::remove((this->connectionName)._M_dataplus._M_p);
  boost::interprocess::shared_memory_object::remove((this->stateName)._M_dataplus._M_p);
  local_80[0]._M_head_impl =
       (message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_> *)
       (this->stateName)._M_dataplus._M_p;
  local_60[0] = (pointer)CONCAT44(local_60[0]._4_4_,2);
  std::
  make_unique<boost::interprocess::shared_memory_object,boost::interprocess::create_only_t_const&,char_const*,boost::interprocess::mode_t>
            ((create_only_t *)&region,(char **)&boost::interprocess::create_only,(mode_t *)local_80)
  ;
  pvVar1 = region.m_base;
  this_01 = &this->queue_state;
  region.m_base = (void *)0x0;
  std::
  __uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
  ::reset((__uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
           *)this_01,(pointer)pvVar1);
  std::
  unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
  ::~unique_ptr((unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                 *)&region);
  boost::interprocess::shared_memory_object::truncate
            ((this_01->_M_t).
             super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
             ._M_t.
             super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
             .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl
             ,(char *)0x130,__length);
  boost::interprocess::mapped_region::mapped_region<boost::interprocess::shared_memory_object>
            (&region,(this_01->_M_t).
                     super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
                     .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>.
                     _M_head_impl,read_write,0,0,(void *)0x0,-1);
  pvVar1 = region.m_base;
  SharedQueueState::SharedQueueState((SharedQueueState *)region.m_base);
  SharedQueueState::setState((SharedQueueState *)pvVar1,startup);
  local_60[0] = (this_00->_M_dataplus)._M_p;
  std::
  make_unique<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>>,boost::interprocess::create_only_t_const&,char_const*,int&,int&>
            ((create_only_t *)local_80,(char **)&boost::interprocess::create_only,(int *)local_60,
             &maxMessages_local);
  __p._M_head_impl = local_80[0]._M_head_impl;
  local_80[0]._M_head_impl =
       (message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_> *)0x0;
  std::
  __uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ::reset((__uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
           *)this,__p._M_head_impl);
  std::
  unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ::~unique_ptr((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                 *)local_80);
  SharedQueueState::setState((SharedQueueState *)pvVar1,connected);
  this->mxSize = __len;
  std::vector<char,_std::allocator<char>_>::resize(&this->buffer,(long)(int)__len);
  this->connected = true;
  boost::interprocess::mapped_region::~mapped_region(&region);
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
}

Assistant:

bool OwnedQueue::connect(const std::string& connection, int maxMessages, int maxSize)
    {
        // remove the old queue if are connecting again
        if (rqueue) {
            ipc_queue::remove(connectionName.c_str());
        }
        if (queue_state) {
            ipc_state::remove(stateName.c_str());
        }
        connectionNameOrig = connection;
        connectionName = stringTranslateToCppName(connection);
        stateName = connectionName + "_state";
        ipc_queue::remove(connectionName.c_str());

        ipc_state::remove(stateName.c_str());

        try {
            queue_state = std::make_unique<ipc_state>(boostipc::create_only,
                                                      stateName.c_str(),
                                                      boostipc::read_write);
        }
        catch (boost::interprocess::interprocess_exception const& ipe) {
            errorString = std::string("Unable to open local state shared memory:") + ipe.what();
            return false;
        }
        queue_state->truncate(sizeof(SharedQueueState) + 256);
        // Map the whole shared memory in this process
        boostipc::mapped_region region(*queue_state, boostipc::read_write);

        auto* sstate = new (region.get_address()) SharedQueueState;
        sstate->setState(queue_state_t::startup);

        try {
            rqueue = std::make_unique<ipc_queue>(boostipc::create_only,
                                                 connectionName.c_str(),
                                                 maxMessages,
                                                 maxSize);
        }
        catch (boost::interprocess::interprocess_exception const& ipe) {
            errorString = std::string("Unable to open local connection:") + ipe.what();
            return false;
        }
        sstate->setState(queue_state_t::connected);
        mxSize = maxSize;
        buffer.resize(maxSize);
        connected = true;
        return true;
    }